

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

uint utf8_next_char(string *input,size_type *i)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  uint uVar4;
  
  pcVar2 = (input->_M_dataplus)._M_p;
  bVar1 = pcVar2[*i];
  if (bVar1 == 0) {
    return 0;
  }
  uVar4 = 2;
  if (((bVar1 & 0xe0) != 0xc0) && (uVar4 = 3, (bVar1 & 0xf0) != 0xe0)) {
    uVar4 = (uint)((bVar1 & 0xf8) == 0xf0) * 3 + 1;
  }
  sVar3 = *i + (ulong)uVar4;
  *i = sVar3;
  if (uVar4 != 3) {
    if (uVar4 == 2) {
      uVar4 = ((byte)pcVar2[sVar3 - 2] & 0x1f) << 6;
    }
    else {
      if (uVar4 == 1) {
        return (int)pcVar2[sVar3 - 1];
      }
      uVar4 = ((byte)pcVar2[sVar3 - 2] & 0x3f) << 6 |
              ((byte)pcVar2[sVar3 - 3] & 0x3f) << 0xc | ((byte)pcVar2[sVar3 - 4] & 7) << 0x12;
    }
    return (byte)pcVar2[sVar3 - 1] & 0x3f | uVar4;
  }
  return (byte)pcVar2[sVar3 - 1] & 0x3f |
         ((byte)pcVar2[sVar3 - 2] & 0x3f) << 6 | ((byte)pcVar2[sVar3 - 3] & 0xf) << 0xc;
}

Assistant:

unsigned int utf8_next_char (const std::string& input, std::string::size_type& i)
{
  if (input[i] == '\0')
    return 0;

  // How many bytes in the sequence?
  int length = utf8_sequence (input[i]);
  i += length;

  // 0xxxxxxx -> 0xxxxxxx
  if (length == 1)
    return input[i - 1];

  // 110yyyyy 10xxxxxx -> 00000yyy yyxxxxxx
  if (length == 2)
    return ((input[i - 2] & 0x1F) << 6) +
            (input[i - 1] & 0x3F);

  // 1110zzzz 10yyyyyy 10xxxxxx -> zzzzyyyy yyxxxxxx
  if (length == 3)
    return ((input[i - 3] & 0xF)  << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // 11110www 10zzzzzz 10yyyyyy 10xxxxxx -> 000wwwzz zzzzyyyy yyxxxxxx
  if (length == 4)
    return ((input[i - 4] & 0x7)  << 18) +
           ((input[i - 3] & 0x3F) << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // Default: pretend as though it's a single character.
  // TODO Or should this throw?
  return input[i - 1];
}